

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralIndexingStructure.hpp
# Opt level: O1

int __thiscall
Indexing::LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
          (LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,
          char *__filename)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 local_30;
  undefined4 local_28;
  char local_24;
  ulong local_20;
  int iStack_18;
  undefined4 uStack_14;
  undefined1 uStack_10;
  undefined3 uStack_f;
  undefined1 uStack_c;
  undefined7 uStack_b;
  
  local_28 = *(undefined4 *)(__filename + 8);
  local_30 = *(undefined8 *)__filename;
  local_24 = __filename[0xc];
  if (local_24 == '\x01') {
    uStack_b = 0;
    local_20 = (ulong)(*(uint5 *)(__filename + 0x10) & 0xffffffff03);
    uVar1 = *(undefined8 *)(__filename + 0x19);
    iStack_18._1_3_ = (uint3)uVar1;
    iStack_18 = (uint)iStack_18._1_3_ << 8;
    uStack_14 = (undefined4)((ulong)uVar1 >> 0x18);
    uStack_10 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_f = (undefined3)*(undefined4 *)(__filename + 0x21);
    uStack_c = (undefined1)((uint)*(undefined4 *)(__filename + 0x21) >> 0x18);
  }
  iVar2 = (*this->_vptr_LiteralIndexingStructure[2])(this,&local_30,0);
  return iVar2;
}

Assistant:

void remove(LeafData ld) { handle(std::move(ld), /* insert = */ false); }